

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbconnection_xi2.cpp
# Opt level: O3

bool __thiscall
QXcbConnection::startSystemMoveResizeForTouch(QXcbConnection *this,xcb_window_t window,int edges)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  QDebug this_00;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  QHash<int,_QWindowSystemInterface::TouchPoint> QVar11;
  undefined8 *puVar12;
  ulong uVar13;
  undefined8 *puVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  byte bVar18;
  QByteArrayView QVar19;
  TouchDeviceData deviceData;
  QDebug local_c0;
  QString local_b8;
  undefined8 local_a0;
  QHash<int,_QWindowSystemInterface::TouchPoint> local_98;
  QHash<int,_QPointF> local_90;
  QArrayData *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 local_40;
  long local_38;
  
  bVar18 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar15 = *(long *)(this + 0x300);
  if (lVar15 == 0) {
    lVar15 = 0;
    uVar17 = 0;
LAB_0014ee36:
    if (uVar17 == 0 && lVar15 == 0) goto LAB_0014f1db;
  }
  else {
    if (**(char **)(lVar15 + 0x20) == -1) {
      uVar13 = 1;
      do {
        uVar17 = uVar13;
        if (*(ulong *)(lVar15 + 0x10) == uVar17) {
          lVar15 = 0;
          uVar17 = 0;
          break;
        }
        uVar13 = uVar17 + 1;
      } while ((*(char **)(lVar15 + 0x20))[(ulong)((uint)uVar17 & 0x7f) + (uVar17 >> 7) * 0x90] ==
               -1);
      goto LAB_0014ee36;
    }
    uVar17 = 0;
  }
  do {
    puVar12 = &DAT_001933e0;
    puVar14 = &local_a0;
    for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar14 = *puVar12;
      puVar12 = puVar12 + (ulong)bVar18 * -2 + 1;
      puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
    }
    lVar10 = (uVar17 >> 7) * 0x90;
    uVar13 = (ulong)((uint)uVar17 & 0x7f);
    lVar7 = *(long *)(*(long *)(lVar15 + 0x20) + 0x80 + lVar10);
    lVar8 = (ulong)*(byte *)(uVar13 + *(long *)(lVar15 + 0x20) + lVar10) * 0x70;
    local_a0 = *(undefined8 *)(lVar7 + 8 + lVar8);
    local_98.d = *(Data **)(lVar7 + 0x10 + lVar8);
    if ((local_98.d != (Data *)0x0) &&
       (((local_98.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      ((local_98.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_98.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_90.d = *(Data **)(lVar7 + 0x18 + lVar8);
    if ((local_90.d != (Data *)0x0) &&
       (((local_90.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      ((local_90.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_90.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_88 = *(QArrayData **)(lVar7 + 0x20 + lVar8);
    local_80 = *(undefined8 *)(lVar7 + 0x28 + lVar8);
    local_78 = *(undefined8 *)(lVar7 + 0x30 + lVar8);
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_40 = *(undefined1 *)(lVar7 + 0x68 + lVar8);
    puVar12 = (undefined8 *)(lVar7 + 0x38 + lVar8);
    local_70 = *puVar12;
    uStack_68 = puVar12[1];
    puVar12 = (undefined8 *)(lVar7 + 0x48 + lVar8);
    local_60 = *puVar12;
    uStack_58 = puVar12[1];
    puVar12 = (undefined8 *)(lVar7 + 0x58 + lVar8);
    local_50 = *puVar12;
    uStack_48 = puVar12[1];
    iVar5 = QInputDevice::type();
    if (iVar5 == 2) {
      if (local_98.d == (Data *)0x0) {
LAB_0014ef83:
        uVar16 = 0;
        QVar11.d = (Data *)0x0;
LAB_0014ef88:
        if (uVar16 == 0 && QVar11.d == (Data *)0x0) goto LAB_0014f151;
      }
      else {
        QVar11.d = local_98.d;
        if ((local_98.d)->spans->offsets[0] == 0xff) {
          uVar6 = 1;
          do {
            uVar16 = uVar6;
            if ((local_98.d)->numBuckets == uVar16) goto LAB_0014ef83;
            uVar6 = uVar16 + 1;
          } while ((local_98.d)->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
          goto LAB_0014ef88;
        }
        uVar16 = 0;
      }
      do {
        pSVar2 = (QVar11.d)->spans;
        uVar6 = uVar16 >> 7;
        uVar9 = (uint)uVar16 & 0x7f;
        pEVar3 = pSVar2[uVar6].entries;
        bVar1 = pEVar3[pSVar2[uVar6].offsets[uVar9]].storage.data[0x58];
        if ((bVar1 < 5) && ((0x16U >> (bVar1 & 0x1f) & 1) != 0)) {
          *(xcb_window_t *)(this + 0x308) = window;
          *(undefined2 *)(this + 0x30c) =
               *(undefined2 *)
                (*(long *)(*(long *)(lVar15 + 0x20) + 0x80 + lVar10) +
                (ulong)*(byte *)(uVar13 + *(long *)(lVar15 + 0x20) + lVar10) * 0x70);
          *(undefined4 *)(this + 0x310) =
               *(undefined4 *)pEVar3[pSVar2[uVar6].offsets[uVar9]].storage.data;
          *(int *)(this + 0x314) = edges;
          this[0x318] = (QXcbConnection)0x1;
          lVar7 = QtPrivateLogging::lcQpaInputDevices();
          if ((*(byte *)(lVar7 + 0x10) & 1) != 0) {
            QMessageLogger::debug();
            this_00.stream = local_c0.stream;
            QVar19.m_data = (storage_type *)0x2a;
            QVar19.m_size = (qsizetype)&local_b8;
            QString::fromUtf8(QVar19);
            QTextStream::operator<<((QTextStream *)this_00.stream,&local_b8);
            if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (*(QTextStream *)(local_c0.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_c0.stream,' ');
            }
            QDebug::~QDebug(&local_c0);
          }
          if ((bVar1 < 5) && ((0x16U >> (bVar1 & 0x1f) & 1) != 0)) {
            if (local_88 != (QArrayData *)0x0) {
              LOCK();
              (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_88,0x18,0x10);
              }
            }
            QHash<int,_QPointF>::~QHash(&local_90);
            QHash<int,_QWindowSystemInterface::TouchPoint>::~QHash(&local_98);
            bVar4 = true;
            goto LAB_0014f21e;
          }
        }
        do {
          if ((QVar11.d)->numBuckets - 1 == uVar16) {
            uVar16 = 0;
            QVar11.d = (Data *)0x0;
            break;
          }
          uVar16 = uVar16 + 1;
        } while ((QVar11.d)->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
      } while ((uVar16 != 0) || (QVar11.d != (Data *)0x0));
    }
LAB_0014f151:
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,0x18,0x10);
      }
    }
    QHash<int,_QPointF>::~QHash(&local_90);
    QHash<int,_QWindowSystemInterface::TouchPoint>::~QHash(&local_98);
    do {
      if (*(long *)(lVar15 + 0x10) - 1U == uVar17) {
        uVar17 = 0;
        lVar15 = 0;
        break;
      }
      uVar17 = uVar17 + 1;
    } while (*(char *)((ulong)((uint)uVar17 & 0x7f) +
                      (uVar17 >> 7) * 0x90 + *(long *)(lVar15 + 0x20)) == -1);
  } while ((uVar17 != 0) || (lVar15 != 0));
LAB_0014f1db:
  bVar4 = false;
LAB_0014f21e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QXcbConnection::startSystemMoveResizeForTouch(xcb_window_t window, int edges)
{
    QHash<int, TouchDeviceData>::const_iterator devIt = m_touchDevices.constBegin();
    for (; devIt != m_touchDevices.constEnd(); ++devIt) {
        TouchDeviceData deviceData = devIt.value();
        if (deviceData.qtTouchDevice->type() == QInputDevice::DeviceType::TouchScreen) {
            auto pointIt = deviceData.touchPoints.constBegin();
            for (; pointIt != deviceData.touchPoints.constEnd(); ++pointIt) {
                QEventPoint::State state = pointIt.value().state;
                if (state == QEventPoint::State::Updated || state == QEventPoint::State::Pressed || state == QEventPoint::State::Stationary) {
                    m_startSystemMoveResizeInfo.window = window;
                    m_startSystemMoveResizeInfo.deviceid = devIt.key();
                    m_startSystemMoveResizeInfo.pointid = pointIt.key();
                    m_startSystemMoveResizeInfo.edges = edges;
                    setDuringSystemMoveResize(true);
                    qCDebug(lcQpaInputDevices) << "triggered system move or resize from touch";
                    return true;
                }
            }
        }
    }
    return false;
}